

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ParsedExpression::Deserialize(ParsedExpression *this,Deserializer *deserializer)

{
  ulong *puVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  ExpressionClass EVar4;
  ExpressionType EVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  pointer pPVar9;
  SerializationException *this_00;
  pointer *__ptr_1;
  pointer *__ptr;
  _func_int **pp_Var10;
  char *pcVar11;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [15];
  char local_29;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"class");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    EVar4 = EnumUtil::FromString<duckdb::ExpressionClass>((char *)local_68._0_8_);
    uVar6 = (uint)EVar4;
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  else {
    uVar6 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    EVar5 = EnumUtil::FromString<duckdb::ExpressionType>((char *)local_68._0_8_);
    uVar7 = (uint)EVar5;
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  else {
    uVar7 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar8 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"alias");
  if ((char)iVar8 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_68[0x10] = '\0';
    local_48._M_allocated_capacity = (size_type)local_38;
    local_38[0] = 0;
    local_38._1_8_ = local_68._17_8_;
    local_38._9_4_ = local_68._25_4_;
    local_38._13_2_ = local_68._29_2_;
    local_29 = local_68[0x1f];
    local_48._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_48,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar8 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"query_location");
  if ((char)iVar8 == '\0') {
    pcVar11 = (char *)0xffffffffffffffff;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar8 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    if (CONCAT44(extraout_var,iVar8) == 0xffffffffffffffff) {
      local_68._0_8_ = (char *)0xffffffffffffffff;
    }
    else {
      optional_idx::optional_idx((optional_idx *)local_68,CONCAT44(extraout_var,iVar8));
    }
    pcVar11 = (char *)local_68._0_8_;
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_68._0_8_ = ZEXT48(uVar7 & 0xff);
  puVar1 = (deserializer->data).enums.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (deserializer->data).enums.c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&(deserializer->data).enums.c,(unsigned_long *)local_68);
  }
  else {
    *puVar1 = local_68._0_8_;
    (deserializer->data).enums.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar1 + 1;
  }
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
  switch(uVar6 & 0xff) {
  case 2:
    CaseExpression::Deserialize((CaseExpression *)local_68,deserializer);
    break;
  case 3:
    CastExpression::Deserialize((CastExpression *)local_68,deserializer);
    break;
  case 4:
    ColumnRefExpression::Deserialize((ColumnRefExpression *)local_68,deserializer);
    break;
  case 5:
    ComparisonExpression::Deserialize((ComparisonExpression *)local_68,deserializer);
    break;
  case 6:
    ConjunctionExpression::Deserialize((ConjunctionExpression *)local_68,deserializer);
    break;
  case 7:
    ConstantExpression::Deserialize((ConstantExpression *)local_68,deserializer);
    break;
  case 8:
    DefaultExpression::Deserialize((Deserializer *)local_68);
    break;
  case 9:
    FunctionExpression::Deserialize((FunctionExpression *)local_68,deserializer);
    break;
  case 10:
    OperatorExpression::Deserialize((OperatorExpression *)local_68,deserializer);
    break;
  case 0xb:
    StarExpression::Deserialize((StarExpression *)local_68,deserializer);
    uVar3 = local_68._0_8_;
    local_68._0_8_ = (_func_int **)0x0;
    pp_Var2 = (this->super_BaseExpression)._vptr_BaseExpression;
    (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)uVar3;
    pp_Var10 = (_func_int **)local_68._0_8_;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))();
      pp_Var10 = (_func_int **)local_68._0_8_;
    }
    goto LAB_0176f572;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Unsupported type for deserialization of ParsedExpression!","");
    SerializationException::SerializationException(this_00,(string *)local_68);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xd:
    SubqueryExpression::Deserialize((SubqueryExpression *)local_68,deserializer);
    break;
  case 0xe:
    WindowExpression::Deserialize((WindowExpression *)local_68,deserializer);
    break;
  case 0xf:
    ParameterExpression::Deserialize((ParameterExpression *)local_68,deserializer);
    break;
  case 0x10:
    CollateExpression::Deserialize((CollateExpression *)local_68,deserializer);
    break;
  case 0x11:
    LambdaExpression::Deserialize((LambdaExpression *)local_68,deserializer);
    break;
  case 0x12:
    PositionalReferenceExpression::Deserialize
              ((PositionalReferenceExpression *)local_68,deserializer);
    break;
  case 0x13:
    BetweenExpression::Deserialize((BetweenExpression *)local_68,deserializer);
    break;
  case 0x14:
    LambdaRefExpression::Deserialize((LambdaRefExpression *)local_68,deserializer);
  }
  uVar3 = local_68._0_8_;
  local_68._0_8_ = (_func_int **)0x0;
  pp_Var10 = (this->super_BaseExpression)._vptr_BaseExpression;
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)uVar3;
LAB_0176f572:
  if (pp_Var10 != (_func_int **)0x0) {
    (**(code **)(*pp_Var10 + 8))();
  }
  Deserializer::Unset<duckdb::ExpressionType>(deserializer);
  pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)this);
  ::std::__cxx11::string::operator=
            ((string *)&(pPVar9->super_BaseExpression).alias,(string *)local_48._M_local_buf);
  pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)this);
  (pPVar9->super_BaseExpression).query_location.index = (idx_t)pcVar11;
  if ((undefined1 *)local_48._M_allocated_capacity != local_38) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ParsedExpression::Deserialize(Deserializer &deserializer) {
	auto expression_class = deserializer.ReadProperty<ExpressionClass>(100, "class");
	auto type = deserializer.ReadProperty<ExpressionType>(101, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(102, "alias");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	deserializer.Set<ExpressionType>(type);
	unique_ptr<ParsedExpression> result;
	switch (expression_class) {
	case ExpressionClass::BETWEEN:
		result = BetweenExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CASE:
		result = CaseExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CAST:
		result = CastExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::COLLATE:
		result = CollateExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::COLUMN_REF:
		result = ColumnRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::COMPARISON:
		result = ComparisonExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CONJUNCTION:
		result = ConjunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::CONSTANT:
		result = ConstantExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::DEFAULT:
		result = DefaultExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::FUNCTION:
		result = FunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::LAMBDA:
		result = LambdaExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::LAMBDA_REF:
		result = LambdaRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::OPERATOR:
		result = OperatorExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::PARAMETER:
		result = ParameterExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::POSITIONAL_REFERENCE:
		result = PositionalReferenceExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::STAR:
		result = StarExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::SUBQUERY:
		result = SubqueryExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::WINDOW:
		result = WindowExpression::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ParsedExpression!");
	}
	deserializer.Unset<ExpressionType>();
	result->alias = std::move(alias);
	result->query_location = query_location;
	return result;
}